

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlCharacters(xmlParserCtxtPtr ctxt,xmlChar *buf,int size)

{
  xmlChar xVar1;
  _xmlSAXHandler *p_Var2;
  charactersSAXFunc p_Var3;
  xmlDocPtr pxVar4;
  ignorableWhitespaceSAXFunc UNRECOVERED_JUMPTABLE;
  xmlNode *node;
  bool bVar5;
  int iVar6;
  int iVar7;
  void *pvVar8;
  xmlNodePtr pxVar9;
  _xmlDtd *p_Var10;
  xmlDocPtr doc;
  xmlChar *pxVar11;
  
  p_Var2 = ctxt->sax;
  if (p_Var2 == (_xmlSAXHandler *)0x0) {
    return;
  }
  if (ctxt->disableSAX != 0) {
    return;
  }
  if ((ctxt->keepBlanks != 0) || (p_Var2->ignorableWhitespace == p_Var2->characters))
  goto LAB_00141834;
  if ((ctxt->space == (int *)0x0) ||
     (((iVar6 = *ctxt->space, iVar6 == -2 || (iVar6 == 1)) ||
      (pxVar9 = ctxt->node, pxVar9 == (xmlNodePtr)0x0)))) {
LAB_0014197e:
    iVar6 = 0;
  }
  else {
    pxVar4 = ctxt->myDoc;
    if (pxVar4 == (xmlDocPtr)0x0) {
LAB_0014193d:
      pxVar11 = ctxt->input->cur;
      xVar1 = *pxVar11;
      if (((xVar1 != '<') && (xVar1 != '\r')) ||
         ((xVar1 == '<' && ((ctxt->node->children == (_xmlNode *)0x0 && (pxVar11[1] == '/'))))))
      goto LAB_0014197e;
      pxVar9 = xmlGetLastChild(ctxt->node);
      if (pxVar9 == (xmlNodePtr)0x0) {
        if ((ctxt->node->type != XML_ELEMENT_NODE) &&
           (iVar6 = 0, ctxt->node->content != (xmlChar *)0x0)) goto LAB_00141980;
      }
      else {
        iVar6 = xmlNodeIsText(pxVar9);
        if (iVar6 != 0) goto LAB_0014197e;
        node = ctxt->node->children;
        if (node != (xmlNode *)0x0) {
          iVar7 = xmlNodeIsText(node);
          iVar6 = 0;
          if (iVar7 != 0) goto LAB_00141980;
        }
      }
      iVar6 = 1;
    }
    else {
      if (pxVar9->ns == (xmlNs *)0x0) {
        pxVar11 = (xmlChar *)0x0;
      }
      else {
        pxVar11 = pxVar9->ns->prefix;
      }
      p_Var10 = pxVar4->intSubset;
      if (p_Var10 == (_xmlDtd *)0x0) {
        pvVar8 = (void *)0x0;
      }
      else {
        pvVar8 = xmlHashLookup2((xmlHashTablePtr)p_Var10->elements,pxVar9->name,pxVar11);
      }
      iVar6 = (int)p_Var10;
      if (pvVar8 == (void *)0x0) {
        if (pxVar4->extSubset == (_xmlDtd *)0x0) {
          pvVar8 = (void *)0x0;
        }
        else {
          pvVar8 = xmlHashLookup2((xmlHashTablePtr)pxVar4->extSubset->elements,ctxt->node->name,
                                  pxVar11);
        }
      }
      if (pvVar8 == (void *)0x0) {
LAB_00141937:
        bVar5 = true;
      }
      else {
        iVar6 = 0;
        if (1 < *(int *)((long)pvVar8 + 0x48) - 2U) {
          if (*(int *)((long)pvVar8 + 0x48) != 4) goto LAB_00141937;
          iVar6 = 1;
        }
        bVar5 = false;
      }
      if (bVar5) goto LAB_0014193d;
    }
  }
LAB_00141980:
  if (iVar6 != 0) {
    UNRECOVERED_JUMPTABLE = ctxt->sax->ignorableWhitespace;
    if (UNRECOVERED_JUMPTABLE == (ignorableWhitespaceSAXFunc)0x0) {
      return;
    }
    (*UNRECOVERED_JUMPTABLE)(ctxt->userData,buf,size);
    return;
  }
LAB_00141834:
  p_Var3 = ctxt->sax->characters;
  if (p_Var3 != (charactersSAXFunc)0x0) {
    (*p_Var3)(ctxt->userData,buf,size);
  }
  if ((ctxt->keepBlanks == 0) && (*ctxt->space == -1)) {
    *ctxt->space = -2;
  }
  return;
}

Assistant:

static void
xmlCharacters(xmlParserCtxtPtr ctxt, const xmlChar *buf, int size) {
    if ((ctxt->sax == NULL) || (ctxt->disableSAX))
        return;

    /*
     * Calling areBlanks with only parts of a text node
     * is fundamentally broken, making the NOBLANKS option
     * essentially unusable.
     */
    if ((!ctxt->keepBlanks) &&
        (ctxt->sax->ignorableWhitespace != ctxt->sax->characters) &&
        (areBlanks(ctxt, buf, size, 1))) {
        if (ctxt->sax->ignorableWhitespace != NULL)
            ctxt->sax->ignorableWhitespace(ctxt->userData, buf, size);
    } else {
        if (ctxt->sax->characters != NULL)
            ctxt->sax->characters(ctxt->userData, buf, size);

        /*
         * The old code used to update this value for "complex" data
         * even if keepBlanks was true. This was probably a bug.
         */
        if ((!ctxt->keepBlanks) && (*ctxt->space == -1))
            *ctxt->space = -2;
    }
}